

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall
testing::internal::ExecDeathTest::ExecDeathTest
          (ExecDeathTest *this,char *a_statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher,char *file,int line)

{
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  int local_2c;
  char *pcStack_28;
  int line_local;
  char *file_local;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *matcher_local;
  char *a_statement_local;
  ExecDeathTest *this_local;
  
  local_2c = line;
  pcStack_28 = file;
  file_local = (char *)matcher;
  matcher_local =
       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)a_statement;
  a_statement_local = (char *)this;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&local_48,matcher);
  ForkingDeathTest::ForkingDeathTest(&this->super_ForkingDeathTest,a_statement,&local_48);
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_48);
  (this->super_ForkingDeathTest).super_DeathTestImpl.super_DeathTest._vptr_DeathTest =
       (_func_int **)&PTR__ExecDeathTest_00202010;
  this->file_ = pcStack_28;
  this->line_ = local_2c;
  return;
}

Assistant:

ExecDeathTest(const char* a_statement, Matcher<const std::string&> matcher,
                const char* file, int line)
      : ForkingDeathTest(a_statement, std::move(matcher)),
        file_(file),
        line_(line) {}